

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# midi_container.cpp
# Opt level: O2

void __thiscall midi_container::trim_start(midi_container *this)

{
  unsigned_long uVar1;
  unsigned_long i;
  unsigned_long start;
  
  uVar1 = ((long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>.
                 _M_impl.super__Vector_impl_data._M_finish -
          (long)(this->m_tracks).super__Vector_base<midi_track,_std::allocator<midi_track>_>._M_impl
                .super__Vector_impl_data._M_start) / 0x18;
  if (this->m_form == 2) {
    for (start = 0; uVar1 != start; start = start + 1) {
      trim_range_of_tracks(this,start,start);
    }
    return;
  }
  trim_range_of_tracks(this,0,uVar1 - 1);
  return;
}

Assistant:

void midi_container::trim_start()
{
    if (m_form == 2)
    {
        for (unsigned long i = 0, j = m_tracks.size(); i < j; ++i)
        {
            trim_range_of_tracks(i, i);
        }
    }
    else
    {
        trim_range_of_tracks(0, m_tracks.size() - 1);
    }
}